

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void __thiscall
Centaurus::MatchRoutineEM64T<unsigned_char>::MatchRoutineEM64T
          (MatchRoutineEM64T<unsigned_char> *this,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *str,Logger *logger)

{
  CodeHolder *this_00;
  Label rejectlabel;
  X86Assembler as;
  MyConstPool pool;
  undefined1 auStack_208 [200];
  anon_union_16_7_ed616b9d_for_Operand__0 local_140 [2];
  undefined1 local_118 [224];
  undefined1 local_38 [16];
  
  this->_vptr_MatchRoutineEM64T = (_func_int **)&PTR__MatchRoutineEM64T_001b2bb8;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  this_00 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,logger);
  }
  asmjit::X86Assembler::X86Assembler((X86Assembler *)(auStack_208 + 0x10),this_00);
  emit_parser_prolog((X86Assembler *)(auStack_208 + 0x10));
  local_140[0]._0_8_ = &DAT_00000032;
  local_140[0]._any.reserved12_4 = 4;
  local_140[0]._any.reserved8_4 = 0x20;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)(auStack_208 + 0x10),0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)&local_140[0]._any);
  MyConstPool::MyConstPool((MyConstPool *)&local_140[0]._any,(X86Assembler *)(auStack_208 + 0x10));
  asmjit::Assembler::newLabel((Assembler *)auStack_208);
  emit((X86Assembler *)(auStack_208 + 0x10),(MyConstPool *)&local_140[0]._any,(Label *)auStack_208,
       str);
  emit_parser_epilog((X86Assembler *)(auStack_208 + 0x10),(Label *)auStack_208);
  (**(code **)(*(long *)local_140[0]._0_8_ + 0x68))(local_140[0]._packed[0].i64,local_38,local_118);
  asmjit::CodeEmitter::finalize((CodeEmitter *)(auStack_208 + 0x10));
  MyConstPool::~MyConstPool((MyConstPool *)&local_140[0]._any);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)(auStack_208 + 0x10));
  return;
}

Assistant:

MatchRoutineEM64T<TCHAR>::MatchRoutineEM64T(const std::basic_string<TCHAR>& str, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    asmjit::Label rejectlabel = as.newLabel();

    emit(as, pool, rejectlabel, str);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();
    
    as.finalize();
}